

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LinearSegmentParameter *this)

{
  ostream *poVar1;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LinearSegmentParameter *local_18;
  LinearSegmentParameter *this_local;
  
  local_18 = this;
  this_local = (LinearSegmentParameter *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"LinearSegmentParameter:\n");
  poVar1 = std::operator<<(poVar1,"\tSegment Number:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SegNum);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tModification:\n");
  poVar1 = std::operator<<(poVar1,"\t\tLocation:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_ModificationUnion).m_ui8Modifications & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t\tOrientation:   ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_ModificationUnion).m_ui8Modifications >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  LinearObjectAppearance::GetAsString_abi_cxx11_(&local_1f0,&this->m_ObjApr);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tLocation:        ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_210,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tOrientation:     ");
  EulerAngles::GetAsString_abi_cxx11_(&local_230,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\tLength:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Length);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tWidth:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Width);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHeight:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Height);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tDepth:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Depth);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LinearSegmentParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LinearSegmentParameter:\n"
       << "\tSegment Number:  " << ( KUINT16 )m_ui8SegNum                     << "\n"
       << "\tModification:\n"
       << "\t\tLocation:      " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\t\tOrientation:   " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << IndentString( m_ObjApr.GetAsString(), 1 )
       << "\tLocation:        " << m_Loc.GetAsString()
       << "\tOrientation:     " << m_Ori.GetAsString()
       << "\tLength:          " << m_ui16Length                                 << "\n"
       << "\tWidth:           " << m_ui16Width                                  << "\n"
       << "\tHeight:          " << m_ui16Height                                 << "\n"
       << "\tDepth:           " << m_ui16Depth                                  << "\n";

    return ss.str();
}